

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O3

void __thiscall
syntax_gtest_tests::syntax_tests::iu_GTestSyntaxTest_x_iutest_x_ExceptionValueNE_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_ExceptionValueNE_Test *this)

{
  undefined4 *puVar1;
  int x;
  AssertionResult iutest_ar;
  AssertionResult ar;
  
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 2;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

TEST(GTestSyntaxTest, ExceptionValueNE)
{
    if( int x = 1 )
        ASSERT_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        EXPECT_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        INFORM_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        ASSUME_THROW_VALUE_NE(throw 2, int, x) << x;
}